

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

type * fmt::v5::sprintf<fmt::v5::basic_string_view<char>,unsigned_long>
                 (basic_string_view<char> *format,unsigned_long *args)

{
  size_t extraout_RDX;
  basic_string_view<char> *in_RSI;
  type *in_RDI;
  basic_string_view<char> s;
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_unsigned_long>
  as;
  basic_string_view<char> *in_stack_00000228;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  in_stack_00000230;
  type *this;
  
  this = in_RDI;
  internal::check_format_string<unsigned_long,fmt::v5::basic_string_view<char>>(in_RSI);
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_unsigned_long>
  ::format_arg_store((format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_unsigned_long>
                      *)this,(unsigned_long *)in_RDI);
  s.size_ = extraout_RDX;
  s.data_ = (char *)in_RSI->size_;
  to_string_view<char>((v5 *)in_RSI->data_,s);
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  ::basic_format_args<unsigned_long>
            ((basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
              *)this,(format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_unsigned_long>
                      *)in_RDI);
  vsprintf<fmt::v5::basic_string_view<char>,char>(in_stack_00000228,in_stack_00000230);
  return this;
}

Assistant:

sprintf(const S &format, const Args & ... args) {
  internal::check_format_string<Args...>(format);
  typedef internal::basic_buffer<FMT_CHAR(S)> buffer;
  typedef typename basic_printf_context_t<buffer>::type context;
  format_arg_store<context, Args...> as{ args... };
  return vsprintf(to_string_view(format),
                  basic_format_args<context>(as));
}